

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFATokenizer.h
# Opt level: O1

GenericToken * __thiscall
SGParser::DFATokenizer<SGParser::GenericToken>::GetNextToken
          (DFATokenizer<SGParser::GenericToken> *this,GenericToken *token)

{
  TokenizerBase *this_00;
  PosTracker *pPVar1;
  PosTracker *pPVar2;
  ushort uVar3;
  char *pcVar4;
  TokenizerBuffer *pTVar5;
  DFA *pDVar6;
  pointer pvVar7;
  long lVar8;
  pointer pLVar9;
  iterator __position;
  pointer puVar10;
  size_t sVar11;
  bool bVar12;
  uint uVar13;
  value_type_conflict2 *pvVar14;
  ulong uVar15;
  uint uVar16;
  uint code;
  char *pcVar17;
  size_t sStack_a8;
  PosTracker lastTailPos;
  undefined1 local_70 [8];
  InputCharReader charReader;
  
  this_00 = &(this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase;
  pPVar1 = &(this->super_TokenizerImpl<SGParser::GenericToken>).TailPos;
  charReader.Pos._0_4_ =
       (uint)(byte)*(this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pTail;
  pPVar2 = &(this->super_TokenizerImpl<SGParser::GenericToken>).HeadPos;
  local_70 = (undefined1  [8])this_00;
  charReader.Reader.Tok = (TokenizerBase *)pPVar1;
  do {
    sVar11 = (this->super_TokenizerImpl<SGParser::GenericToken>).TailPos.Offset;
    pPVar2->Line = pPVar1->Line;
    (this->super_TokenizerImpl<SGParser::GenericToken>).HeadPos.Offset = sVar11;
    TokenizerBase::AdjustHead(this_00);
    if ((*(TokenizerBuffer **)((long)local_70 + 0x18))->pBufferTail <=
        *(char **)((long)local_70 + 0x10)) {
      code = 1;
      break;
    }
    uVar15 = (ulong)(this->pDFA->ExpressionStartStates).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start[this->ExpressionStackTop];
    pcVar4 = (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pHead;
    pTVar5 = (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pHeadBuffer;
    sStack_a8 = pPVar1->Line;
    lastTailPos.Line = (this->super_TokenizerImpl<SGParser::GenericToken>).TailPos.Offset;
    uVar16 = 0xffff;
    charReader.Character = 0;
    charReader._20_4_ = 0;
    pcVar17 = (char *)0x0;
    do {
      pDVar6 = this->pDFA;
      pvVar14 = MappedTable<unsigned_int,_4294967295U>::GetValue
                          (&pDVar6->CharTable,(ulong)(uint)charReader.Pos);
      pvVar7 = (pDVar6->TransitionTable).
               super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = *(long *)&pvVar7[uVar15].
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl;
      pvVar7 = pvVar7 + uVar15;
      uVar15 = 0xffff;
      if ((ulong)*pvVar14 <
          (ulong)((long)*(pointer *)
                         ((long)&(pvVar7->
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 )._M_impl + 8) - lVar8 >> 1)) {
        uVar15 = (ulong)*(ushort *)(lVar8 + (ulong)*pvVar14 * 2);
      }
      if ((int)uVar15 == 0xffff) break;
      uVar3 = (this->pDFA->AcceptStates).
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15];
      if (uVar3 == 0) {
        bVar12 = TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                 ::Advance((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                            *)local_70);
      }
      else {
        bVar12 = TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                 ::Advance((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                            *)local_70);
        sStack_a8 = pPVar1->Line;
        lastTailPos.Line = (this->super_TokenizerImpl<SGParser::GenericToken>).TailPos.Offset;
        pcVar17 = (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pTail;
        charReader._16_8_ =
             (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pTailBuffer;
        uVar16 = (uint)uVar3;
      }
    } while (bVar12 != false);
    if (uVar16 == 0xffff) {
      if (((*(char **)((long)local_70 + 0x10) <
            (*(TokenizerBuffer **)((long)local_70 + 0x18))->pBufferTail) ||
          (pcVar4 != (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pTail))
         || (code = 1,
            pTVar5 != (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.
                      pTailBuffer)) {
        (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pTail = pcVar4;
        (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pTailBuffer = pTVar5
        ;
        sVar11 = (this->super_TokenizerImpl<SGParser::GenericToken>).HeadPos.Offset;
        pPVar1->Line = pPVar2->Line;
        (this->super_TokenizerImpl<SGParser::GenericToken>).TailPos.Offset = sVar11;
        code = 0;
        if (*(char **)((long)local_70 + 0x10) <
            (*(TokenizerBuffer **)((long)local_70 + 0x18))->pBufferTail) {
          TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>::
          Advance((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                   *)local_70);
        }
      }
      GenericToken::CopyFromTokenizer(token,code,&this->super_TokenizerImpl<SGParser::GenericToken>)
      ;
      bVar12 = false;
    }
    else {
      (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pTail = pcVar17;
      (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pTailBuffer =
           (TokenizerBuffer *)charReader._16_8_;
      pPVar1->Line = sStack_a8;
      (this->super_TokenizerImpl<SGParser::GenericToken>).TailPos.Offset = lastTailPos.Line;
      pLVar9 = (this->pDFA->LexemeInfos).
               super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      code = pLVar9[uVar16].TokenCode;
      uVar13 = pLVar9[uVar16].Action & 0xf0000000;
      bVar12 = true;
      if (uVar13 == 0x10000000) {
LAB_00105b83:
        this->ExpressionStackTop = pLVar9[uVar16].Action & 0xfffffff;
      }
      else if (uVar13 == 0x30000000) {
        puVar10 = (this->ExpressionStack).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start == puVar10) {
          this->ExpressionStackTop = 0;
          bVar12 = false;
          GenericToken::CopyFromTokenizer
                    (token,0,&this->super_TokenizerImpl<SGParser::GenericToken>);
        }
        else {
          this->ExpressionStackTop = puVar10[-1];
          (this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar10 + -1;
        }
      }
      else if (uVar13 == 0x20000000) {
        __position._M_current =
             (this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->ExpressionStack,
                     __position,&this->ExpressionStackTop);
        }
        else {
          *__position._M_current = this->ExpressionStackTop;
          (this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        goto LAB_00105b83;
      }
    }
    if (!bVar12) {
      return token;
    }
  } while (code == 0);
  GenericToken::CopyFromTokenizer(token,code,&this->super_TokenizerImpl<SGParser::GenericToken>);
  return token;
}

Assistant:

Token& DFATokenizer<Token>::GetNextToken(Token& token) {
    CodeType        code;
    InputCharReader charReader{ByteReader{*this}, TailPos};

    do {
        // If we are tracking the position
        // than adjust the head values
        HeadPos = TailPos;

        // Move the head to tail
        AdjustHead();

        // If tail's passed the end, EOF
        if (charReader.IsEOF()) {
            token.CopyFromTokenizer(TokenCode::TokenEOF, *this);
            return token;
        }

        // Try to find the longest matching lexeme
        // Keep going through the DFA until we hit an error condition,
        // that is, we get stuck and have nowhere to go

        // The initial state of a DFA is always the zeroth state
        unsigned state        = pDFA->GetExpressionStartState(ExpressionStackTop);
        unsigned lastLexemeID = DFA::EmptyTransition;
        // Last recognized Tail
        BufferPos lastTail;
        // Save start head, so that we can see if we moved at all
        BufferPos startHead{GetHeadPos()};

        // Save the last tail line and column position
        PosTracker lastTailPos{TailPos};

        unsigned accept;

        do {
            // Get the next state out of the table
            state = pDFA->GetTransitionState(state, charReader.GetChar());

            // EmptyTransition means error condition
            if (state == pDFA->EmptyTransition)
                break;

            // If it's an accepting state, record the pTail position and
            // lexeme ID so we can return them if this turns out to be the longest lexeme
            if (accept = pDFA->GetAcceptState(state); accept != 0u) {
                lastLexemeID = accept;
                accept       = charReader.Advance() ? 1u : 0u;
                lastTailPos  = TailPos;
                lastTail     = GetTailPos();
            } else
                accept = charReader.Advance() ? 1u : 0u;

        } while (accept != 0u);

        // If we didn't find a valid lexeme, raise an error, unless we've
        // got an empty lexeme. In this case, there are simply no more characters
        // remaining in the input stream
        if (lastLexemeID == DFA::EmptyTransition) {
            // If we didn't move, and its the end of file, report EOF
            if (charReader.IsEOF() && startHead == GetTailPos())
                code = TokenCode::TokenEOF;
            else {
                // Error - nothing recognized
                SetTailPos(startHead);
                TailPos = HeadPos;
                code    = TokenCode::TokenError;
                if (!charReader.IsEOF())
                    charReader.Advance();
            }
            token.CopyFromTokenizer(code, *this);
            return token;
        }

        // Put the pTail at the end of the lexeme found
        SetTailPos(lastTail);
        // Set the line/offset values to the end of the last lexeme found
        TailPos = lastTailPos;

        // Otherwise, return the lexeme
        // Should be [*pHead, *LastTailPos]
        const auto& lexinfo = pDFA->GetLexemeInfo(lastLexemeID);
        code                = lexinfo.TokenCode;

        // Perform an action, if any
        switch (lexinfo.Action & LexemeInfo::ActionMask) {
            case LexemeInfo::ActionPush:
                ExpressionStack.push_back(ExpressionStackTop);
                // Fall through to goto
                [[fallthrough]];

            case LexemeInfo::ActionGoto:
                ExpressionStackTop = lexinfo.Action & LexemeInfo::ActionValueMask;
                break;

            case LexemeInfo::ActionPop:
                if (!ExpressionStack.empty()) {
                    ExpressionStackTop = ExpressionStack.back();
                    ExpressionStack.pop_back();
                } else { // Empty stack, error
                    ExpressionStackTop = 0u;
                    token.CopyFromTokenizer(TokenCode::TokenError, *this);
                    return token;
                }
                break;
        }

        // if code == 0, then ignore token
    } while (code == 0u);

    token.CopyFromTokenizer(code, *this);
    return token;
}